

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

InvertibleRepresentation * __thiscall HFactor::getInvert(HFactor *this)

{
  InvertibleRepresentation *in_RDI;
  InvertibleRepresentation *invert;
  vector<double,_std::allocator<double>_> *in_stack_00000058;
  vector<double,_std::allocator<double>_> *in_stack_00000060;
  
  InvertibleRepresentation::InvertibleRepresentation(in_RDI);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
             (vector<int,_std::allocator<int>_> *)in_stack_00000058);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
             (vector<int,_std::allocator<int>_> *)in_stack_00000058);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
             (vector<int,_std::allocator<int>_> *)in_stack_00000058);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
             (vector<int,_std::allocator<int>_> *)in_stack_00000058);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000060,in_stack_00000058);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
             (vector<int,_std::allocator<int>_> *)in_stack_00000058);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
             (vector<int,_std::allocator<int>_> *)in_stack_00000058);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000060,in_stack_00000058);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
             (vector<int,_std::allocator<int>_> *)in_stack_00000058);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
             (vector<int,_std::allocator<int>_> *)in_stack_00000058);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000060,in_stack_00000058);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
             (vector<int,_std::allocator<int>_> *)in_stack_00000058);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
             (vector<int,_std::allocator<int>_> *)in_stack_00000058);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
             (vector<int,_std::allocator<int>_> *)in_stack_00000058);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000060,in_stack_00000058);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
             (vector<int,_std::allocator<int>_> *)in_stack_00000058);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
             (vector<int,_std::allocator<int>_> *)in_stack_00000058);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
             (vector<int,_std::allocator<int>_> *)in_stack_00000058);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
             (vector<int,_std::allocator<int>_> *)in_stack_00000058);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000060,in_stack_00000058);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
             (vector<int,_std::allocator<int>_> *)in_stack_00000058);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
             (vector<int,_std::allocator<int>_> *)in_stack_00000058);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000060,in_stack_00000058);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
             (vector<int,_std::allocator<int>_> *)in_stack_00000058);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000060,in_stack_00000058);
  return in_RDI;
}

Assistant:

InvertibleRepresentation HFactor::getInvert() const {
  InvertibleRepresentation invert;
  invert.l_pivot_index = this->l_pivot_index;
  invert.l_pivot_lookup = this->l_pivot_lookup;
  invert.l_start = this->l_start;
  invert.l_index = this->l_index;
  invert.l_value = this->l_value;
  invert.lr_start = this->lr_start;
  invert.lr_index = this->lr_index;
  invert.lr_value = this->lr_value;

  invert.u_pivot_lookup = this->u_pivot_lookup;
  invert.u_pivot_index = this->u_pivot_index;
  invert.u_pivot_value = this->u_pivot_value;
  invert.u_start = this->u_start;
  invert.u_last_p = this->u_last_p;
  invert.u_index = this->u_index;
  invert.u_value = this->u_value;

  invert.ur_start = this->ur_start;
  invert.ur_lastp = this->ur_lastp;
  invert.ur_space = this->ur_space;
  invert.ur_index = this->ur_index;
  invert.ur_value = this->ur_value;
  invert.pf_start = this->pf_start;
  invert.pf_index = this->pf_index;
  invert.pf_value = this->pf_value;
  invert.pf_pivot_index = this->pf_pivot_index;
  invert.pf_pivot_value = this->pf_pivot_value;
  return invert;
}